

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Node * prvTidyParseDefList(TidyDocImpl *doc,Node *list,GetTokenMode mode)

{
  uint uVar1;
  TidyParserMemory *pTVar2;
  Lexer *pLVar3;
  Dict *pDVar4;
  Dict *pDVar5;
  Bool BVar6;
  int iVar7;
  Node *pNVar8;
  Node *pNVar9;
  Node **ppNVar10;
  int iVar11;
  Node *pNVar12;
  Node *pNVar13;
  TidyParserMemory memory;
  undefined8 uStack_50;
  
  if (list == (Node *)0x0) {
    uVar1 = (doc->stack).top;
    pTVar2 = (doc->stack).content;
    list = pTVar2[uVar1].original_node;
    pNVar9 = pTVar2[uVar1].reentry_node;
    iVar11 = pTVar2[uVar1].reentry_state;
    (doc->stack).top = uVar1 - 1;
  }
  else {
    pNVar9 = (Node *)0x0;
    iVar11 = 0;
  }
  if ((list->tag->model & 1) == 0) {
    pLVar3 = doc->lexer;
    pLVar3->insert = (IStack *)0x0;
    pNVar8 = pNVar9;
    pNVar13 = (Node *)0x0;
LAB_001393fa:
    while( true ) {
      if (iVar11 == 0) {
        pNVar8 = prvTidyGetToken(doc,IgnoreWhitespace);
      }
      else if (iVar11 == 2) {
        prvTidyReport(doc,list,pNVar9,0x25a);
        return (Node *)0x0;
      }
      if (iVar11 == 0) break;
      if (iVar11 == 1) {
        pLVar3->excludeBlocks = yes;
        iVar11 = 0;
        pNVar9 = pNVar8;
        if ((pNVar13 != (Node *)0x0) && (pNVar13->last == pNVar8)) {
          list = prvTidyInferredTag(doc,TidyTag_DL);
          pNVar12 = pNVar8->parent;
          list->parent = pNVar12;
          if ((pNVar12 == (Node *)0x0) || (pNVar12->last != pNVar8)) {
            pNVar12 = pNVar8->next;
            list->next = pNVar12;
            if (pNVar12 != (Node *)0x0) {
              ppNVar10 = &pNVar12->prev;
              goto LAB_001396b2;
            }
          }
          else {
            ppNVar10 = &pNVar12->last;
LAB_001396b2:
            *ppNVar10 = list;
          }
          pNVar8->next = list;
          list->prev = pNVar8;
          iVar11 = 0;
        }
      }
    }
    if (pNVar8 == (Node *)0x0) {
      iVar11 = 2;
      pNVar9 = (Node *)0x0;
      pNVar8 = (Node *)0x0;
      goto LAB_001393fa;
    }
    if ((pNVar8->tag != list->tag) || (pNVar8->type != EndTag)) {
      BVar6 = InsertMisc(list,pNVar8);
      if (BVar6 == no) {
        BVar6 = prvTidynodeIsText(pNVar8);
        if (BVar6 != no) {
          prvTidyUngetToken(doc);
          pNVar8 = prvTidyInferredTag(doc,TidyTag_DT);
          prvTidyReport(doc,list,pNVar8,0x261);
        }
        pDVar4 = pNVar8->tag;
        if (pDVar4 == (Dict *)0x0) {
          prvTidyReport(doc,list,pNVar8,0x235);
          prvTidyFreeNode(doc,pNVar8);
          goto LAB_001393fa;
        }
        pNVar12 = pNVar13;
        pNVar9 = pNVar8;
        if (pNVar8->type == EndTag) {
          pNVar12 = list;
          if ((pNVar8 == (Node *)0x0) || (pDVar4->id != TidyTag_FORM)) {
            do {
              pNVar12 = pNVar12->parent;
              if (pNVar12 == (Node *)0x0) {
                iVar7 = 0;
                goto LAB_001395e1;
              }
              pDVar5 = pNVar12->tag;
              if ((pDVar5 != (Dict *)0x0) && (pDVar5->id == TidyTag_BODY)) {
                prvTidyReport(doc,list,pNVar8,0x235);
                prvTidyFreeNode(doc,pNVar8);
                iVar7 = 2;
                goto LAB_001395e1;
              }
            } while (pDVar4 != pDVar5);
            prvTidyReport(doc,list,pNVar8,0x259);
            prvTidyUngetToken(doc);
            iVar7 = 1;
          }
          else {
            *(byte *)&doc->badForm = (byte)doc->badForm | 1;
            prvTidyReport(doc,list,pNVar8,0x235);
            prvTidyFreeNode(doc,pNVar8);
            iVar7 = 2;
            pNVar12 = pNVar13;
          }
LAB_001395e1:
          pNVar13 = pNVar12;
          if (iVar7 == 2) goto LAB_001393fa;
          if (iVar7 != 0) {
            return (Node *)0x0;
          }
        }
        if ((pNVar8 == (Node *)0x0) || (pDVar4 = pNVar8->tag, pDVar4 == (Dict *)0x0)) {
LAB_00139633:
          prvTidyUngetToken(doc);
          uVar1 = pNVar8->tag->model;
          if ((uVar1 & 0x18) == 0) {
            prvTidyReport(doc,list,pNVar8,0x27e);
            return (Node *)0x0;
          }
          if (((uVar1 & 0x10) == 0) && (pLVar3->excludeBlocks != no)) {
            return (Node *)0x0;
          }
          pNVar9 = prvTidyInferredTag(doc,TidyTag_DD);
          prvTidyReport(doc,list,pNVar9,0x261);
        }
        else {
          if (pDVar4->id == TidyTag_CENTER) {
            if (list->content == (Node *)0x0) {
              prvTidyInsertNodeBeforeElement(list,pNVar8);
            }
            else {
              pNVar9 = list->parent;
              pNVar8->parent = pNVar9;
              if ((pNVar9 == (Node *)0x0) || (pNVar9->last != list)) {
                pNVar9 = list->next;
                pNVar8->next = pNVar9;
                if (pNVar9 != (Node *)0x0) {
                  ppNVar10 = &pNVar9->prev;
                  goto LAB_001397c3;
                }
              }
              else {
                ppNVar10 = &pNVar9->last;
LAB_001397c3:
                *ppNVar10 = pNVar8;
              }
              list->next = pNVar8;
              pNVar8->prev = list;
            }
            pLVar3->excludeBlocks = no;
            uStack_50 = 0x100000000;
            goto LAB_0013980a;
          }
          if ((pDVar4 == (Dict *)0x0) ||
             ((pDVar4->id != TidyTag_DT &&
              ((pDVar4 == (Dict *)0x0 ||
               ((pDVar4->id != TidyTag_DD &&
                (((pDVar4 == (Dict *)0x0 || (pDVar4->id != TidyTag_DIV)) ||
                 (BVar6 = prvTidyIsHTML5Mode(doc), BVar6 == no)))))))))) goto LAB_00139633;
        }
        pNVar8 = pNVar9;
        if (pNVar9->type != EndTag) {
          pNVar9->parent = list;
          if (list == (Node *)0x0) {
            pNVar9->prev = (Node *)0x0;
LAB_0013976b:
            if (list != (Node *)0x0) {
              ppNVar10 = &list->content;
              goto LAB_00139774;
            }
          }
          else {
            pNVar13 = list->last;
            pNVar9->prev = pNVar13;
            if (pNVar13 == (Node *)0x0) goto LAB_0013976b;
            ppNVar10 = &pNVar13->next;
LAB_00139774:
            *ppNVar10 = pNVar9;
            if (list != (Node *)0x0) {
              list->last = pNVar9;
            }
          }
          uStack_50 = 0;
LAB_0013980a:
          prvTidypushMemory(doc,(TidyParserMemory)
                                ZEXT3248(CONCAT824(uStack_50,
                                                   CONCAT816(pNVar8,CONCAT88(list,
                                                  prvTidyParseDefList)))));
          return pNVar8;
        }
        prvTidyReport(doc,list,pNVar9,0x235);
        prvTidyFreeNode(doc,pNVar9);
        pNVar13 = pNVar12;
      }
      goto LAB_001393fa;
    }
    prvTidyFreeNode(doc,pNVar8);
    list->closed = yes;
  }
  return (Node *)0x0;
}

Assistant:

Node* TY_(ParseDefList)( TidyDocImpl* doc, Node *list, GetTokenMode mode )
{
    Lexer* lexer = doc->lexer;
    Node *node = NULL;
    Node *parent = NULL;
    DEBUG_LOG_COUNTERS;

    enum parserState {
        STATE_INITIAL,                /* This is the initial state for every parser. */
        STATE_POST_NODEISCENTER,      /* To-do after re-entering after checks. */
        STATE_COMPLETE,               /* Done with the switch. */
    } state = STATE_INITIAL;

    if ( list == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        list = memory.original_node;
        state = memory.reentry_state;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(list);
    }

    if (list->tag->model & CM_EMPTY)
        return NULL;

    lexer->insert = NULL;  /* defer implicit inline start tags */

    while ( state != STATE_COMPLETE )
    {
        if ( state == STATE_INITIAL )
            node = TY_(GetToken)( doc, IgnoreWhitespace);
        
        switch ( state)
        {
            case STATE_INITIAL:
            {
                if ( node == NULL)
                {
                    state = STATE_COMPLETE;
                    continue;
                }

                if (node->tag == list->tag && node->type == EndTag)
                {
                    TY_(FreeNode)( doc, node);
                    list->closed = yes;
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                /* deal with comments etc. */
                if (InsertMisc(list, node))
                    continue;

                if (TY_(nodeIsText)(node))
                {
                    TY_(UngetToken)( doc );
                    node = TY_(InferredTag)(doc, TidyTag_DT);
                    TY_(Report)(doc, list, node, MISSING_STARTTAG);
                }

                if (node->tag == NULL)
                {
                    TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /*
                  if this is the end tag for an ancestor element
                  then infer end tag for this element
                */
                if (node->type == EndTag)
                {
                    Bool discardIt = no;
                    if ( nodeIsFORM(node) )
                    {
                        BadForm( doc );
                        TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node );
                        continue;
                    }

                    for (parent = list->parent;
                            parent != NULL; parent = parent->parent)
                    {
                       /* Do not match across BODY to avoid infinite loop
                          between ParseBody and this parser,
                          See http://tidy.sf.net/bug/1098012. */
                        if (nodeIsBODY(parent))
                        {
                            discardIt = yes;
                            break;
                        }
                        if (node->tag == parent->tag)
                        {
                            TY_(Report)(doc, list, node, MISSING_ENDTAG_BEFORE);
                            TY_(UngetToken)( doc );

                            DEBUG_LOG_EXIT;
                            return NULL;
                        }
                    }
                    if (discardIt)
                    {
                        TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }
                }

                /* center in a dt or a dl breaks the dl list in two */
                if ( nodeIsCENTER(node) )
                {
                    if (list->content)
                        TY_(InsertNodeAfterElement)(list, node);
                    else /* trim empty dl list */
                    {
                        TY_(InsertNodeBeforeElement)(list, node);
                    }

                    /* #426885 - fix by Glenn Carroll 19 Apr 00, and
                                 Gary Dechaines 11 Aug 00 */
                    /* ParseTag can destroy node, if it finds that
                     * this <center> is followed immediately by </center>.
                     * It's awkward but necessary to determine if this
                     * has happened.
                     */
                    parent = node->parent;

                    /* and parse contents of center */
                    lexer->excludeBlocks = no;

                    {
                        TidyParserMemory memory = {0};
                        memory.identity = TY_(ParseDefList);
                        memory.original_node = list;
                        memory.reentry_node = node;
                        memory.reentry_state = STATE_POST_NODEISCENTER;
                        TY_(pushMemory)( doc, memory );
                        DEBUG_LOG_EXIT_WITH_NODE(node);
                        return node;
                    }
                }

                if ( !( nodeIsDT(node) || nodeIsDD(node) || ( nodeIsDIV(node) && TY_(IsHTML5Mode)(doc) ) ) )
                {
                    TY_(UngetToken)( doc );

                    if (!(node->tag->model & (CM_BLOCK | CM_INLINE)))
                    {
                        TY_(Report)(doc, list, node, TAG_NOT_ALLOWED_IN);
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    /* if DD appeared directly in BODY then exclude blocks */
                    if (!(node->tag->model & CM_INLINE) && lexer->excludeBlocks)
                    {
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    node = TY_(InferredTag)(doc, TidyTag_DD);
                    TY_(Report)(doc, list, node, MISSING_STARTTAG);
                }

                if (node->type == EndTag)
                {
                    TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /* node should be <DT> or <DD> or <DIV>*/
                TY_(InsertNodeAtEnd)(list, node);
                {
                    TidyParserMemory memory = {0};
                    memory.identity = TY_(ParseDefList);
                    memory.original_node = list;
                    memory.reentry_node = node;
                    memory.reentry_state = STATE_INITIAL;
                    TY_(pushMemory)( doc, memory );
                    DEBUG_LOG_EXIT;
                    return node;
                }
            } break;


            case STATE_POST_NODEISCENTER:
            {
                lexer->excludeBlocks = yes;

                /* now create a new dl element,
                 * unless node has been blown away because the
                 * center was empty, as above.
                 */
                if (parent && parent->last == node)
                {
                    list = TY_(InferredTag)(doc, TidyTag_DL);
                    TY_(InsertNodeAfterElement)(node, list);
                }
                state = STATE_INITIAL;
                continue;
            } break;


            default:
                break;
        } /* switch */
    } /* while */

    TY_(Report)(doc, list, node, MISSING_ENDTAG_FOR);
    DEBUG_LOG_EXIT;
    return NULL;
}